

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOrValue * __thiscall
kj::_::ExceptionOrValue::operator=(ExceptionOrValue *this,ExceptionOrValue *other)

{
  if (other != this) {
    if ((this->exception).ptr.isSet == true) {
      (this->exception).ptr.isSet = false;
      Exception::~Exception(&(this->exception).ptr.field_1.value);
    }
    if ((other->exception).ptr.isSet == true) {
      Exception::Exception
                (&(this->exception).ptr.field_1.value,&(other->exception).ptr.field_1.value);
      (this->exception).ptr.isSet = true;
    }
  }
  if ((other->exception).ptr.isSet == true) {
    (other->exception).ptr.isSet = false;
    Exception::~Exception(&(other->exception).ptr.field_1.value);
  }
  return this;
}

Assistant:

ExceptionOrValue& operator=(ExceptionOrValue&& other) = default;